

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_diag_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_table_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int64_t iVar1;
  undefined4 uVar2;
  int *piVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  parasail_result_t *ppVar20;
  int64_t *ptr;
  undefined1 (*ptr_00) [16];
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  long lVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  int64_t iVar25;
  ulong uVar26;
  long lVar27;
  int64_t iVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  int64_t iVar32;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  bool bVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar46 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar49 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar80 [64];
  long local_618;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  long local_340 [4];
  long local_320 [4];
  long local_300;
  long lStack_2f8;
  long lStack_2f0;
  long lStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  long local_260 [4];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  long local_220;
  long lStack_218;
  long lStack_210;
  long lStack_208;
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  ulong local_180;
  ulong uStack_178;
  ulong uStack_170;
  ulong uStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  if (_s2 == (char *)0x0) {
    parasail_sw_stats_table_diag_avx2_256_64_cold_8();
    return (parasail_result_t *)0x0;
  }
  uVar40 = CONCAT44(0,s2Len);
  if (s2Len < 1) {
    parasail_sw_stats_table_diag_avx2_256_64_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sw_stats_table_diag_avx2_256_64_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sw_stats_table_diag_avx2_256_64_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_stats_table_diag_avx2_256_64_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_sw_stats_table_diag_avx2_256_64_cold_3();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_sw_stats_table_diag_avx2_256_64_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sw_stats_table_diag_avx2_256_64_cold_1();
      return (parasail_result_t *)0x0;
    }
    if (matrix->type == 0) goto LAB_007dd082;
  }
  _s1Len = matrix->length;
LAB_007dd082:
  iVar30 = matrix->min;
  uVar33 = (ulong)(uint)open;
  uVar37 = 0x8000000000000000 - (long)iVar30;
  if (iVar30 != -open && SBORROW4(iVar30,-open) == iVar30 + open < 0) {
    uVar37 = uVar33 | 0x8000000000000000;
  }
  lVar27 = uVar37 + 1;
  iVar30 = matrix->max;
  local_360._8_8_ = lVar27;
  local_360._0_8_ = lVar27;
  local_360._16_8_ = lVar27;
  local_360._24_8_ = lVar27;
  local_380._8_8_ = lVar27;
  local_380._0_8_ = lVar27;
  local_380._16_8_ = lVar27;
  local_380._24_8_ = lVar27;
  local_280._8_8_ = lVar27;
  local_280._0_8_ = lVar27;
  local_280._16_8_ = lVar27;
  local_280._24_8_ = lVar27;
  auVar55 = in_ZMM14._0_16_;
  local_340[0] = lVar27;
  local_340[1] = lVar27;
  local_340[2] = lVar27;
  local_340[3] = lVar27;
  local_320[0] = lVar27;
  local_320[1] = lVar27;
  local_320[2] = lVar27;
  local_320[3] = lVar27;
  local_260[0] = lVar27;
  local_260[1] = lVar27;
  local_260[2] = lVar27;
  local_260[3] = lVar27;
  ppVar20 = parasail_result_new_table3(_s1Len,s2Len);
  if (ppVar20 != (parasail_result_t *)0x0) {
    iVar16 = _s1Len + 3;
    ppVar20->flag = ppVar20->flag | 0x4831004;
    ptr = parasail_memalign_int64_t(0x20,(long)iVar16);
    uVar37 = (ulong)(s2Len + 6);
    ptr_00 = (undefined1 (*) [16])parasail_memalign_int64_t(0x20,uVar37);
    ptr_01 = parasail_memalign_int64_t(0x20,uVar37);
    ptr_02 = parasail_memalign_int64_t(0x20,uVar37);
    ptr_03 = parasail_memalign_int64_t(0x20,uVar37);
    ptr_04 = parasail_memalign_int64_t(0x20,uVar37);
    ptr_05 = parasail_memalign_int64_t(0x20,uVar37);
    ptr_06 = parasail_memalign_int64_t(0x20,uVar37);
    ptr_07 = parasail_memalign_int64_t(0x20,uVar37);
    ptr_08 = parasail_memalign_int64_t(0x20,uVar37);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = ptr_03;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = ptr_04;
    auVar48 = vpunpcklqdq_avx(auVar48,auVar50);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = ptr_05;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = ptr_06;
    auVar50 = vpunpcklqdq_avx(auVar43,auVar46);
    auVar43 = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar48;
    auVar46 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar50;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = ptr;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = ptr_00;
    auVar48 = vpunpcklqdq_avx(auVar47,auVar51);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = ptr_01;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = ptr_02;
    auVar50 = vpunpcklqdq_avx(auVar52,auVar53);
    auVar48 = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar48;
    auVar50 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar50;
    auVar49._0_8_ = -(ulong)(auVar48._0_8_ == 0);
    lVar39 = SUB648(ZEXT1664((undefined1  [16])0x0),8);
    auVar49._8_8_ = -(ulong)(auVar48._8_8_ == lVar39);
    auVar49._16_8_ = -(ulong)(auVar50._0_8_ == 0);
    auVar49._24_8_ = -(ulong)(auVar50._8_8_ == 0);
    auVar44._0_8_ = -(ulong)(auVar43._0_8_ == 0);
    auVar44._8_8_ = -(ulong)(auVar43._8_8_ == lVar39);
    auVar44._16_8_ = -(ulong)(auVar46._0_8_ == 0);
    auVar44._24_8_ = -(ulong)(auVar46._8_8_ == 0);
    auVar44 = vpackssdw_avx2(auVar49,auVar44);
    if ((ptr_08 != (int64_t *)0x0 && ptr_07 != (int64_t *)0x0) &&
        ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
              (auVar44 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar44 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            SUB321(auVar44 >> 0x7f,0) == '\0') &&
           (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          SUB321(auVar44 >> 0xbf,0) == '\0') &&
         (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar44[0x1f]))
    {
      local_300 = 0x7ffffffffffffffe - (long)iVar30;
      local_1a0._4_4_ = 0;
      local_1a0._0_4_ = gap;
      lVar39 = (long)_s1Len;
      if (0 < _s1Len) {
        piVar3 = matrix->mapper;
        lVar24 = 0;
        do {
          ptr[lVar24] = (long)piVar3[(byte)_s1[lVar24]];
          lVar24 = lVar24 + 1;
        } while (lVar39 != lVar24);
      }
      uVar17 = s2Len + 3;
      auVar11._8_8_ = lVar27;
      auVar11._0_8_ = lVar27;
      auVar11._16_8_ = lVar27;
      auVar11._24_8_ = lVar27;
      local_200 = vpblendd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar11,0x3f);
      local_1a0._8_4_ = gap;
      local_1a0._12_4_ = 0;
      local_1a0._16_4_ = gap;
      local_1a0._20_4_ = 0;
      local_1a0._24_4_ = gap;
      local_1a0._28_4_ = 0;
      local_1c0._8_4_ = s2Len;
      local_1c0._0_8_ = uVar40;
      local_1c0._12_4_ = 0;
      local_1c0._16_4_ = s2Len;
      local_1c0._20_4_ = 0;
      local_1c0._24_4_ = s2Len;
      local_1c0._28_4_ = 0;
      iVar30 = _s1Len + 1U;
      if ((int)(_s1Len + 1U) < iVar16) {
        iVar30 = iVar16;
      }
      uVar37 = 0;
      auVar80 = ZEXT1664(auVar55);
      lStack_2f8 = local_300;
      lStack_2f0 = local_300;
      lStack_2e8 = local_300;
      local_220 = lVar39;
      lStack_218 = lVar39;
      lStack_210 = lVar39;
      lStack_208 = lVar39;
      local_180 = uVar33;
      uStack_178 = uVar33;
      uStack_170 = uVar33;
      uStack_168 = uVar33;
      memset(ptr + lVar39,0,(ulong)(uint)(~_s1Len + iVar30) * 8 + 8);
      piVar3 = matrix->mapper;
      do {
        *(long *)(ptr_00[1] + uVar37 * 8 + 8) = (long)piVar3[(byte)_s2[uVar37]];
        uVar37 = uVar37 + 1;
      } while (uVar40 != uVar37);
      *ptr_00 = (undefined1  [16])0x0;
      *(undefined8 *)ptr_00[1] = 0;
      uVar18 = s2Len + 1U;
      if ((int)(s2Len + 1U) < (int)uVar17) {
        uVar18 = uVar17;
      }
      memset(ptr_00[1] + uVar40 * 8 + 8,0,(ulong)(~s2Len + uVar18) * 8 + 8);
      uVar37 = 0;
      do {
        ptr_01[uVar37 + 3] = 0;
        ptr_02[uVar37 + 3] = 0;
        ptr_03[uVar37 + 3] = 0;
        ptr_04[uVar37 + 3] = 0;
        ptr_05[uVar37 + 3] = lVar27;
        ptr_06[uVar37 + 3] = 0;
        ptr_07[uVar37 + 3] = 0;
        ptr_08[uVar37 + 3] = 0;
        uVar37 = uVar37 + 1;
      } while (uVar40 != uVar37);
      lVar24 = 0;
      do {
        *(long *)((long)ptr_01 + lVar24) = lVar27;
        *(undefined8 *)((long)ptr_02 + lVar24) = 0;
        *(undefined8 *)((long)ptr_03 + lVar24) = 0;
        *(undefined8 *)((long)ptr_04 + lVar24) = 0;
        *(long *)((long)ptr_05 + lVar24) = lVar27;
        *(undefined8 *)((long)ptr_06 + lVar24) = 0;
        *(undefined8 *)((long)ptr_07 + lVar24) = 0;
        *(undefined8 *)((long)ptr_08 + lVar24) = 0;
        lVar24 = lVar24 + 8;
      } while (lVar24 != 0x18);
      lVar24 = 0;
      do {
        ptr_01[uVar40 + lVar24 + 3] = lVar27;
        ptr_02[uVar40 + lVar24 + 3] = 0;
        ptr_03[uVar40 + lVar24 + 3] = 0;
        ptr_04[uVar40 + lVar24 + 3] = 0;
        ptr_05[uVar40 + lVar24 + 3] = lVar27;
        ptr_06[uVar40 + lVar24 + 3] = 0;
        ptr_07[uVar40 + lVar24 + 3] = 0;
        ptr_08[uVar40 + lVar24 + 3] = 0;
        lVar24 = lVar24 + 1;
      } while (s2Len + (int)lVar24 < (int)uVar17);
      ptr_01[2] = 0;
      local_460._8_8_ = lStack_2f8;
      local_460._0_8_ = local_300;
      local_460._16_8_ = lStack_2f0;
      local_460._24_8_ = lStack_2e8;
      local_360 = local_280;
      local_380 = local_280;
      local_480 = local_280;
      local_420 = local_280;
      local_400 = local_280;
      local_3e0 = local_280;
      if (0 < _s1Len) {
        piVar3 = matrix->matrix;
        uVar18 = _s1Len - 1;
        uVar37 = 1;
        if (1 < (int)uVar17) {
          uVar37 = (ulong)uVar17;
        }
        lVar21 = uVar40 * 0x10;
        lVar24 = uVar40 * 4 + -4;
        lVar29 = uVar40 * 0xc + -0xc;
        local_618 = uVar40 * 8 + -8;
        local_440._8_8_ = 2;
        local_440._0_8_ = 3;
        local_440._16_8_ = 1;
        local_440._24_8_ = 0;
        lVar31 = 0;
        local_1e0 = 1;
        uStack_1d8 = 1;
        uStack_1d0 = 1;
        uStack_1c8 = 1;
        local_240 = 4;
        uStack_238 = 4;
        uStack_230 = 4;
        uStack_228 = 4;
        uVar33 = 0;
        local_480._8_8_ = lVar27;
        local_480._0_8_ = lVar27;
        local_480._16_8_ = lVar27;
        local_480._24_8_ = lVar27;
        auVar75 = ZEXT3264(local_480);
        auVar71 = ZEXT3264(local_480);
        auVar70 = ZEXT3264(local_480);
        local_420 = local_480;
        local_400 = local_480;
        local_3e0 = local_480;
        do {
          uVar34 = uVar33 | 2;
          if (matrix->type == 0) {
            uVar36 = ptr[uVar33];
            iVar28 = ptr[uVar33 + 1];
            iVar25 = ptr[uVar33 + 2];
            iVar32 = ptr[uVar33 + 3];
          }
          else {
            uVar17 = (uint)uVar33;
            uVar22 = uVar18;
            if ((long)(uVar33 | 1) < lVar39) {
              uVar22 = uVar17 | 1;
            }
            iVar28 = (int64_t)(int)uVar22;
            uVar22 = uVar17 | 2;
            if (lVar39 <= (long)uVar34) {
              uVar22 = uVar18;
            }
            iVar25 = (int64_t)(int)uVar22;
            uVar17 = uVar17 | 3;
            if (lVar39 <= (long)(uVar33 | 3)) {
              uVar17 = uVar18;
            }
            iVar32 = (int64_t)(int)uVar17;
            uVar36 = uVar33;
          }
          local_140 = vpermpd_avx2(*(undefined1 (*) [32])(ptr + uVar33),0x1b);
          auVar14 = local_140;
          lVar38 = (long)matrix->size;
          local_580 = ZEXT832(0) << 0x20;
          auVar12._8_8_ = lStack_218;
          auVar12._0_8_ = local_220;
          auVar12._16_8_ = lStack_210;
          auVar12._24_8_ = lStack_208;
          local_160 = vpcmpgtq_avx2(auVar12,local_440);
          uVar26 = 0;
          auVar10._8_8_ = lVar27;
          auVar10._0_8_ = lVar27;
          auVar10._16_8_ = lVar27;
          auVar10._24_8_ = lVar27;
          auVar60 = ZEXT1664((undefined1  [16])0x0);
          auVar79 = ZEXT864(0) << 0x40;
          auVar45 = ZEXT1664((undefined1  [16])0x0);
          local_5c0 = auVar45._0_32_;
          auVar63 = ZEXT864(0) << 0x40;
          auVar74 = ZEXT864(0) << 0x40;
          local_3a0 = ZEXT1632(ZEXT816(0));
          local_3c0 = ZEXT1632(ZEXT816(0));
          local_e0._0_8_ = 0;
          local_e0._8_8_ = 0;
          local_e0._16_8_ = 0;
          local_e0._24_8_ = 0;
          auVar44 = vpcmpeqd_avx2(auVar80._0_32_,auVar80._0_32_);
          auVar80 = ZEXT3264(auVar44);
          auVar44 = local_200;
          auVar49 = local_200;
          local_5a0 = local_5c0;
          local_560 = auVar10;
          local_4c0 = local_5c0;
          local_4a0 = auVar10;
          auVar11 = _DAT_009090c0;
          do {
            local_120 = auVar11;
            local_c0 = auVar75._0_32_;
            local_a0 = auVar71._0_32_;
            local_80 = auVar70._0_32_;
            auVar12 = vpermq_avx2(auVar49,0xf9);
            iVar1 = ptr_01[uVar26 + 3];
            auVar76._8_8_ = iVar1;
            auVar76._0_8_ = iVar1;
            auVar76._16_8_ = iVar1;
            auVar76._24_8_ = iVar1;
            local_100 = vpblendd_avx2(auVar12,auVar76,0xc0);
            local_2c0._8_8_ = local_e0._8_8_;
            local_2c0._0_8_ = local_e0._0_8_;
            local_2c0._16_8_ = local_e0._16_8_;
            local_2c0._24_8_ = local_e0._24_8_;
            auVar12 = vpermpd_avx2(auVar74._0_32_,0xf9);
            iVar1 = ptr_02[uVar26 + 3];
            auVar56._8_8_ = iVar1;
            auVar56._0_8_ = iVar1;
            auVar56._16_8_ = iVar1;
            auVar56._24_8_ = iVar1;
            local_e0 = vblendpd_avx(auVar12,auVar56,8);
            auVar12 = vpermpd_avx2(auVar63._0_32_,0xf9);
            iVar1 = ptr_03[uVar26 + 3];
            auVar66._8_8_ = iVar1;
            auVar66._0_8_ = iVar1;
            auVar66._16_8_ = iVar1;
            auVar66._24_8_ = iVar1;
            auVar12 = vblendpd_avx(auVar12,auVar66,8);
            auVar9._8_8_ = uStack_178;
            auVar9._0_8_ = local_180;
            auVar9._16_8_ = uStack_170;
            auVar9._24_8_ = uStack_168;
            auVar56 = vpsubq_avx2(auVar49,auVar9);
            auVar10 = vpsubq_avx2(auVar10,local_1a0);
            auVar49 = vpcmpgtq_avx2(auVar56,auVar10);
            auVar66 = vblendvpd_avx(local_5a0,auVar74._0_32_,auVar49);
            auVar76 = vblendvpd_avx(local_5c0,auVar63._0_32_,auVar49);
            auVar7 = vblendvpd_avx(auVar10,auVar56,auVar49);
            auVar8 = vblendvpd_avx(local_4c0,auVar45._0_32_,auVar49);
            auVar49 = vpermpd_avx2(auVar45._0_32_,0xf9);
            iVar1 = ptr_04[uVar26 + 3];
            auVar61._8_8_ = iVar1;
            auVar61._0_8_ = iVar1;
            auVar61._16_8_ = iVar1;
            auVar61._24_8_ = iVar1;
            auVar56 = vblendpd_avx(auVar49,auVar61,8);
            auVar49 = vpermq_avx2(local_4a0,0xf9);
            iVar1 = ptr_05[uVar26 + 3];
            auVar57._8_8_ = iVar1;
            auVar57._0_8_ = iVar1;
            auVar57._16_8_ = iVar1;
            auVar57._24_8_ = iVar1;
            auVar57 = vpblendd_avx2(auVar49,auVar57,0xc0);
            auVar49 = vpermpd_avx2(auVar79._0_32_,0xf9);
            iVar1 = ptr_06[uVar26 + 3];
            auVar62._8_8_ = iVar1;
            auVar62._0_8_ = iVar1;
            auVar62._16_8_ = iVar1;
            auVar62._24_8_ = iVar1;
            auVar49 = vblendpd_avx(auVar49,auVar62,8);
            auVar10 = vpermq_avx2(auVar60._0_32_,0xf9);
            iVar1 = ptr_07[uVar26 + 3];
            auVar67._8_8_ = iVar1;
            auVar67._0_8_ = iVar1;
            auVar67._16_8_ = iVar1;
            auVar67._24_8_ = iVar1;
            auVar59 = vpblendd_avx2(auVar10,auVar67,0xc0);
            auVar10 = vpermpd_avx2(local_580,0xf9);
            iVar1 = ptr_08[uVar26 + 3];
            auVar73._8_8_ = iVar1;
            auVar73._0_8_ = iVar1;
            auVar73._16_8_ = iVar1;
            auVar73._24_8_ = iVar1;
            auVar10 = vblendpd_avx(auVar10,auVar73,8);
            auVar57 = vpsubq_avx2(auVar57,local_1a0);
            auVar58 = vpsubq_avx2(local_100,auVar9);
            auVar9 = vpcmpgtq_avx2(auVar58,auVar57);
            local_4a0 = vblendvpd_avx(auVar57,auVar58,auVar9);
            auVar61 = local_e0;
            auVar57 = vblendvpd_avx(auVar49,local_e0,auVar9);
            local_2a0 = vblendvpd_avx(auVar59,auVar12,auVar9);
            auVar49 = vblendvpd_avx(auVar10,auVar56,auVar9);
            auVar10 = vpermq_avx2(local_560,0xf9);
            lVar4 = *(long *)(ptr_00[1] + uVar26 * 8 + 8);
            auVar68._8_8_ = lVar4;
            auVar68._0_8_ = lVar4;
            auVar68._16_8_ = lVar4;
            auVar68._24_8_ = lVar4;
            local_560 = vpblendd_avx2(auVar10,auVar68,0xc0);
            auVar58._0_8_ = -(ulong)(local_560._0_8_ == local_140._0_8_);
            auVar58._8_8_ = -(ulong)(local_560._8_8_ == local_140._8_8_);
            auVar58._16_8_ = -(ulong)(local_560._16_8_ == local_140._16_8_);
            auVar58._24_8_ = -(ulong)(local_560._24_8_ == local_140._24_8_);
            auVar58 = vpsubq_avx2(local_2c0,auVar58);
            auVar55._8_8_ = 0;
            auVar55._0_8_ = (long)piVar3[uVar36 * lVar38 + lVar4];
            auVar64._8_8_ = 0;
            auVar64._0_8_ = (long)piVar3[iVar28 * lVar38 + *(long *)(ptr_00[1] + uVar26 * 8)];
            auVar55 = vpunpcklqdq_avx(auVar64,auVar55);
            auVar65._8_8_ = 0;
            auVar65._0_8_ = (long)piVar3[iVar25 * lVar38 + *(long *)(*ptr_00 + uVar26 * 8 + 8)];
            auVar72._8_8_ = 0;
            auVar72._0_8_ = (long)piVar3[iVar32 * lVar38 + *(long *)(*ptr_00 + uVar26 * 8)];
            auVar48 = vpunpcklqdq_avx(auVar72,auVar65);
            auVar59._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar48;
            auVar59._16_16_ = ZEXT116(1) * auVar55;
            auVar10 = vpaddq_avx2(auVar59,auVar44);
            auVar44 = vpcmpgtq_avx2(auVar10,auVar7);
            auVar44 = vblendvpd_avx(auVar7,auVar10,auVar44);
            auVar9 = vpcmpgtq_avx2(auVar59,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar59 = vpsubq_avx2(local_3c0,auVar9);
            auVar9 = vpcmpgtq_avx2(auVar44,local_4a0);
            auVar44 = vblendvpd_avx(local_4a0,auVar44,auVar9);
            auVar9 = vpcmpgtq_avx2(auVar44,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            local_2e0 = vpand_avx2(auVar9,auVar44);
            auVar69._0_8_ = -(ulong)(local_2e0._0_8_ == auVar10._0_8_);
            auVar69._8_8_ = -(ulong)(local_2e0._8_8_ == auVar10._8_8_);
            auVar69._16_8_ = -(ulong)(local_2e0._16_8_ == auVar10._16_8_);
            auVar69._24_8_ = -(ulong)(local_2e0._24_8_ == auVar10._24_8_);
            auVar78._0_8_ = -(ulong)(local_2e0._0_8_ == local_4a0._0_8_);
            auVar78._8_8_ = -(ulong)(local_2e0._8_8_ == local_4a0._8_8_);
            auVar78._16_8_ = -(ulong)(local_2e0._16_8_ == local_4a0._16_8_);
            auVar78._24_8_ = -(ulong)(local_2e0._24_8_ == local_4a0._24_8_);
            local_2c0 = auVar57;
            auVar10 = vblendvpd_avx(auVar66,auVar57,auVar78);
            auVar10 = vblendvpd_avx(auVar10,auVar58,auVar69);
            auVar9 = vblendvpd_avx(auVar76,local_2a0,auVar78);
            auVar9 = vblendvpd_avx(auVar9,auVar59,auVar69);
            auVar62 = auVar80._0_32_;
            auVar58 = vpsubq_avx2(local_3a0,auVar62);
            local_580 = vpsubq_avx2(auVar49,auVar62);
            auVar59 = vpsubq_avx2(auVar8,auVar62);
            auVar49 = vblendvpd_avx(auVar59,local_580,auVar78);
            auVar49 = vblendvpd_avx(auVar49,auVar58,auVar69);
            auVar8._8_8_ = 1;
            auVar8._0_8_ = 1;
            auVar8._16_8_ = 1;
            auVar8._24_8_ = 1;
            auVar44 = vpcmpgtq_avx2(auVar8,auVar44);
            auVar77._0_8_ = -(ulong)(auVar11._0_8_ == auVar80._0_8_);
            auVar77._8_8_ = -(ulong)(auVar11._8_8_ == auVar80._8_8_);
            auVar77._16_8_ = -(ulong)(auVar11._16_8_ == auVar80._16_8_);
            auVar77._24_8_ = -(ulong)(auVar11._24_8_ == auVar80._24_8_);
            auVar58 = vpor_avx2(auVar77,auVar44);
            auVar44 = vpandn_avx2(auVar58,auVar10);
            auVar8 = vpandn_avx2(auVar58,auVar9);
            auVar63 = ZEXT3264(auVar8);
            auVar9 = vpandn_avx2(auVar58,auVar49);
            auVar45 = ZEXT3264(auVar9);
            auVar49 = vpandn_avx2(auVar77,local_2e0);
            auVar10 = vpcmpeqd_avx2(auVar10,auVar10);
            if (3 < uVar26) {
              auVar58 = vpcmpgtq_avx2(auVar49,local_460);
              local_460 = vblendvpd_avx(auVar49,local_460,auVar58);
              auVar58 = vpcmpgtq_avx2(local_480,auVar49);
              auVar58 = vblendvpd_avx(auVar49,local_480,auVar58);
              auVar67 = vpcmpgtq_avx2(auVar58,auVar44);
              auVar58 = vblendvpd_avx(auVar44,auVar58,auVar67);
              auVar67 = vpcmpgtq_avx2(auVar58,auVar8);
              auVar58 = vblendvpd_avx(auVar8,auVar58,auVar67);
              auVar67 = vpcmpgtq_avx2(auVar58,auVar9);
              local_480 = vblendvpd_avx(auVar9,auVar58,auVar67);
            }
            lVar4 = *((ppVar20->field_4).trace)->trace_del_table;
            if (uVar26 < uVar40) {
              uVar2 = vextractps_avx(auVar49._16_16_,2);
              *(undefined4 *)(lVar4 + lVar31 + uVar26 * 4) = uVar2;
            }
            bVar6 = (long)(uVar33 | 1) < lVar39;
            bVar41 = uVar26 - 1 < uVar40;
            if (bVar41 && bVar6) {
              *(int *)(lVar4 + lVar24 + uVar26 * 4) = auVar49._16_4_;
            }
            if (((long)uVar34 < lVar39) && ((long)(uVar26 - 2) < (long)uVar40 && 1 < uVar26)) {
              *(int *)(lVar4 + local_618 + uVar26 * 4) = auVar49._8_4_;
            }
            bVar5 = (long)(uVar33 | 3) < lVar39;
            bVar42 = 2 < uVar26;
            if (bVar42 && bVar5) {
              *(int *)(lVar4 + lVar29 + uVar26 * 4) = auVar49._0_4_;
            }
            lVar4 = *(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 8);
            if (uVar26 < uVar40) {
              uVar2 = vextractps_avx(auVar44._16_16_,2);
              *(undefined4 *)(lVar4 + lVar31 + uVar26 * 4) = uVar2;
            }
            if (bVar41 && bVar6) {
              *(int *)(lVar4 + lVar24 + uVar26 * 4) = auVar44._16_4_;
            }
            if (((long)uVar34 < lVar39) && ((long)(uVar26 - 2) < (long)uVar40 && 1 < uVar26)) {
              *(int *)(local_618 + lVar4 + uVar26 * 4) = auVar44._8_4_;
            }
            if (bVar42 && bVar5) {
              *(int *)(lVar4 + lVar29 + uVar26 * 4) = auVar44._0_4_;
            }
            lVar4 = *(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 0x10);
            if (uVar26 < uVar40) {
              uVar2 = vextractps_avx(auVar8._16_16_,2);
              *(undefined4 *)(lVar4 + lVar31 + uVar26 * 4) = uVar2;
            }
            if (bVar41 && bVar6) {
              *(int *)(lVar4 + lVar24 + uVar26 * 4) = auVar8._16_4_;
            }
            if (((long)uVar34 < lVar39) && ((long)(uVar26 - 2) < (long)uVar40 && 1 < uVar26)) {
              *(int *)(local_618 + lVar4 + uVar26 * 4) = auVar8._8_4_;
            }
            if (bVar42 && bVar5) {
              *(int *)(lVar4 + lVar29 + uVar26 * 4) = auVar8._0_4_;
            }
            lVar4 = *(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 0x18);
            if (uVar26 < uVar40) {
              uVar2 = vextractps_avx(auVar9._16_16_,2);
              *(undefined4 *)(lVar4 + lVar31 + uVar26 * 4) = uVar2;
            }
            if (bVar41 && bVar6) {
              *(int *)(lVar4 + lVar24 + uVar26 * 4) = auVar9._16_4_;
            }
            if (((long)uVar34 < lVar39) && ((long)(uVar26 - 2) < (long)uVar40 && 1 < uVar26)) {
              *(int *)(local_618 + lVar4 + uVar26 * 4) = auVar9._8_4_;
            }
            if (bVar42 && bVar5) {
              *(int *)(lVar4 + lVar29 + uVar26 * 4) = auVar9._0_4_;
            }
            auVar58 = vpcmpgtq_avx2(auVar11,auVar10);
            auVar10 = vpcmpgtq_avx2(local_1c0,auVar11);
            auVar10 = vpand_avx2(auVar10,local_160);
            auVar10 = vpand_avx2(auVar10,auVar58);
            auVar55 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
            auVar62 = vpcmpeqd_avx2(auVar62,auVar62);
            auVar80 = ZEXT3264(auVar62);
            auVar54._0_8_ = -(ulong)(auVar49._0_8_ == local_420._0_8_);
            auVar54._8_8_ = -(ulong)(auVar49._8_8_ == local_420._8_8_);
            auVar54._16_8_ = -(ulong)(auVar49._16_8_ == local_420._16_8_);
            auVar54._24_8_ = -(ulong)(auVar49._24_8_ == local_420._24_8_);
            auVar67 = vpcmpgtq_avx2(auVar49,local_420);
            auVar58 = vpand_avx2(auVar67,auVar10);
            local_420 = vblendvpd_avx(local_420,local_2e0,auVar58);
            auVar48 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
            auVar58 = vpcmpgtq_avx2(local_c0,auVar11);
            auVar58 = vpand_avx2(auVar58,auVar54);
            auVar50 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
            auVar55 = vblendvps_avx(auVar48,auVar55,auVar50);
            auVar68 = vpmovsxdq_avx2(auVar55);
            auVar74 = ZEXT3264(auVar44);
            local_400 = vblendvpd_avx(local_400,auVar44,auVar68);
            local_3e0 = vblendvpd_avx(local_3e0,auVar8,auVar68);
            local_360 = vblendvpd_avx(auVar71._0_32_,auVar9,auVar68);
            auVar71 = ZEXT3264(local_360);
            local_380 = vblendvpd_avx(auVar70._0_32_,local_440,auVar68);
            auVar70 = ZEXT3264(local_380);
            auVar58 = vpor_avx2(auVar58,auVar67);
            auVar10 = vpand_avx2(auVar10,auVar58);
            local_280 = vblendvpd_avx(local_c0,auVar11,auVar10);
            auVar75 = ZEXT3264(local_280);
            auVar13._8_8_ = lVar27;
            auVar13._0_8_ = lVar27;
            auVar13._16_8_ = lVar27;
            auVar13._24_8_ = lVar27;
            auVar10 = vblendvpd_avx(auVar7,auVar13,auVar77);
            local_5a0 = vandnpd_avx(auVar77,auVar66);
            local_5c0 = vandnpd_avx(auVar77,auVar76);
            ptr_01[uVar26] = auVar49._0_8_;
            iVar1 = vmovlpd_avx(auVar44._0_16_);
            ptr_02[uVar26] = iVar1;
            ptr_03[uVar26] = auVar8._0_8_;
            ptr_04[uVar26] = auVar9._0_8_;
            iVar1 = vmovlpd_avx(local_4a0._0_16_);
            ptr_05[uVar26] = iVar1;
            auVar79 = ZEXT3264(auVar57);
            iVar1 = vmovlps_avx(auVar57._0_16_);
            ptr_06[uVar26] = iVar1;
            auVar60 = ZEXT3264(local_2a0);
            ptr_07[uVar26] = local_2a0._0_8_;
            iVar1 = vmovlps_avx(local_580._0_16_);
            ptr_08[uVar26] = iVar1;
            local_4c0 = vandnpd_avx(auVar77,auVar59);
            auVar11 = vpsubq_avx2(auVar11,auVar62);
            uVar26 = uVar26 + 1;
            auVar44 = local_100;
            local_3c0 = auVar12;
            local_3a0 = auVar56;
          } while (uVar37 != uVar26);
          auVar7._8_8_ = 4;
          auVar7._0_8_ = 4;
          auVar7._16_8_ = 4;
          auVar7._24_8_ = 4;
          local_440 = vpaddq_avx2(local_440,auVar7);
          uVar33 = uVar33 + 4;
          lVar31 = lVar31 + lVar21;
          lVar24 = lVar24 + lVar21;
          lVar29 = lVar29 + lVar21;
          local_618 = local_618 + lVar21;
          local_140 = auVar14;
          local_e0 = auVar61;
        } while ((long)uVar33 < lVar39);
      }
      local_260[0] = local_420._0_8_;
      local_260[1] = local_420._8_8_;
      local_260[2] = local_420._16_8_;
      local_260[3] = local_420._24_8_;
      local_320[0] = local_400._0_8_;
      local_320[1] = local_400._8_8_;
      local_320[2] = local_400._16_8_;
      local_320[3] = local_400._24_8_;
      local_340[0] = local_3e0._0_8_;
      local_340[1] = local_3e0._8_8_;
      local_340[2] = local_3e0._16_8_;
      local_340[3] = local_3e0._24_8_;
      lVar31 = 0;
      iVar30 = 0;
      iVar16 = 0;
      lVar39 = lVar27;
      lVar24 = lVar27;
      lVar21 = lVar27;
      lVar29 = lVar27;
      do {
        lVar38 = local_260[lVar31];
        if (lVar21 < lVar38) {
          lVar39 = local_320[lVar31];
          lVar24 = local_340[lVar31];
          lVar29 = local_340[lVar31 + -4];
          iVar30 = *(int *)(local_380 + lVar31 * 8);
          lVar21 = lVar38;
          iVar16 = (int)local_260[lVar31 + -4];
        }
        else if (lVar38 == lVar21) {
          lVar38 = local_260[lVar31 + -4];
          if (lVar38 < iVar16) {
            lVar39 = local_320[lVar31];
            lVar24 = local_340[lVar31];
            lVar29 = local_340[lVar31 + -4];
            iVar30 = *(int *)(local_380 + lVar31 * 8);
            iVar16 = (int)lVar38;
          }
          else if ((lVar38 == iVar16) && (*(long *)(local_380 + lVar31 * 8) < (long)iVar30)) {
            lVar39 = local_320[lVar31];
            lVar24 = local_340[lVar31];
            lVar29 = local_340[lVar31 + -4];
            iVar30 = (int)*(long *)(local_380 + lVar31 * 8);
            iVar16 = (int)lVar38;
          }
        }
        iVar35 = (int)lVar29;
        iVar23 = (int)lVar24;
        iVar19 = (int)lVar39;
        lVar31 = lVar31 + 1;
      } while ((int)lVar31 != 4);
      auVar14._8_8_ = lVar27;
      auVar14._0_8_ = lVar27;
      auVar14._16_8_ = lVar27;
      auVar14._24_8_ = lVar27;
      auVar44 = vpcmpgtq_avx2(auVar14,local_460);
      auVar15._8_8_ = lStack_2f8;
      auVar15._0_8_ = local_300;
      auVar15._16_8_ = lStack_2f0;
      auVar15._24_8_ = lStack_2e8;
      auVar49 = vpcmpgtq_avx2(local_480,auVar15);
      auVar44 = vpor_avx2(auVar49,auVar44);
      if ((((auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           SUB321(auVar44 >> 0x7f,0) != '\0') || SUB321(auVar44 >> 0xbf,0) != '\0') ||
          auVar44[0x1f] < '\0') {
        *(byte *)&ppVar20->flag = (byte)ppVar20->flag | 0x40;
        lVar21 = 0;
        iVar19 = 0;
        iVar23 = 0;
        iVar35 = 0;
        iVar16 = 0;
        iVar30 = 0;
      }
      ppVar20->score = (int)lVar21;
      ppVar20->end_query = iVar30;
      ppVar20->end_ref = iVar16;
      ((ppVar20->field_4).stats)->matches = iVar19;
      ((ppVar20->field_4).stats)->similar = iVar23;
      ((ppVar20->field_4).stats)->length = iVar35;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar20;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(32, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i case1 = vZero;
        __m256i case2 = vZero;
        __m256i case0 = vZero;
        __m256i vNH = vNegInf0;
        __m256i vNM = vZero;
        __m256i vNS = vZero;
        __m256i vNL = vZero;
        __m256i vWH = vNegInf0;
        __m256i vWM = vZero;
        __m256i vWS = vZero;
        __m256i vWL = vZero;
        __m256i vE = vNegInf;
        __m256i vE_opn = vNegInf;
        __m256i vE_ext = vNegInf;
        __m256i vEM = vZero;
        __m256i vES = vZero;
        __m256i vEL = vZero;
        __m256i vF = vNegInf;
        __m256i vF_opn = vNegInf;
        __m256i vF_ext = vNegInf;
        __m256i vFM = vZero;
        __m256i vFS = vZero;
        __m256i vFL = vZero;
        __m256i vJ = vJreset;
        __m256i vs1 = _mm256_set_epi64x_rpl(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3]);
        __m256i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m256i vIltLimit = _mm256_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            __m256i vNWM = vNM;
            __m256i vNWS = vNS;
            __m256i vNWL = vNL;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vNM = _mm256_srli_si256_rpl(vWM, 8);
            vNM = _mm256_insert_epi64_rpl(vNM, HM_pr[j], 3);
            vNS = _mm256_srli_si256_rpl(vWS, 8);
            vNS = _mm256_insert_epi64_rpl(vNS, HS_pr[j], 3);
            vNL = _mm256_srli_si256_rpl(vWL, 8);
            vNL = _mm256_insert_epi64_rpl(vNL, HL_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vFM = _mm256_srli_si256_rpl(vFM, 8);
            vFM = _mm256_insert_epi64_rpl(vFM, FM_pr[j], 3);
            vFS = _mm256_srli_si256_rpl(vFS, 8);
            vFS = _mm256_insert_epi64_rpl(vFS, FS_pr[j], 3);
            vFL = _mm256_srli_si256_rpl(vFL, 8);
            vFL = _mm256_insert_epi64_rpl(vFL, FL_pr[j], 3);
            vF_opn = _mm256_sub_epi64(vNH, vOpen);
            vF_ext = _mm256_sub_epi64(vF, vGap);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vNM, case1);
            vFS = _mm256_blendv_epi8(vFS, vNS, case1);
            vFL = _mm256_blendv_epi8(vFL, vNL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vE_opn = _mm256_sub_epi64(vWH, vOpen);
            vE_ext = _mm256_sub_epi64(vE, vGap);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vWM, case1);
            vES = _mm256_blendv_epi8(vES, vWS, case1);
            vEL = _mm256_blendv_epi8(vEL, vWL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vs2 = _mm256_srli_si256_rpl(vs2, 8);
            vs2 = _mm256_insert_epi64_rpl(vs2, s2[j], 3);
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            vWH = _mm256_max_epi64_rpl(vWH, vZero);
            case1 = _mm256_cmpeq_epi64(vWH, vNWH);
            case2 = _mm256_cmpeq_epi64(vWH, vF);
            case0 = _mm256_cmpeq_epi64(vWH, vZero);
            vWM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vNWM,
                        _mm256_and_si256(
                            _mm256_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWM = _mm256_blendv_epi8(vWM, vZero, case0);
            vWS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vNWS,
                        _mm256_and_si256(
                            _mm256_cmpgt_epi64(vMat,vZero),
                            vOne)),
                    case1);
            vWS = _mm256_blendv_epi8(vWS, vZero, case0);
            vWL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vNWL, vOne), case1);
            vWL = _mm256_blendv_epi8(vWL, vZero, case0);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vWM = _mm256_andnot_si256(cond, vWM);
                vWS = _mm256_andnot_si256(cond, vWS);
                vWL = _mm256_andnot_si256(cond, vWL);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm256_andnot_si256(cond, vEM);
                vES = _mm256_andnot_si256(cond, vES);
                vEL = _mm256_andnot_si256(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            HM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWM,0);
            HS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWS,0);
            HL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWL,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            FM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFM,0);
            FS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFS,0);
            FL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi64(vJ, vNegOne),
                        _mm256_cmplt_epi64_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi64(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi64(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm256_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm256_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm256_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vMaxM = _mm256_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm256_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm256_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *m = (int64_t*)&vMaxM;
        int64_t *s = (int64_t*)&vMaxS;
        int64_t *l = (int64_t*)&vMaxL;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++m, ++s, ++l, ++i, ++j) {
            if (*t > score) {
                score = *t;
                matches = *m;
                similar = *s;
                length = *l;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}